

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O1

EnumValueDescriptor * __thiscall
google::protobuf::FileDescriptorTables::FindEnumValueByNumberCreatingIfUnknown
          (FileDescriptorTables *this,EnumDescriptor *parent,int number)

{
  WrappedMutex *__mutex;
  Tables *this_00;
  long lVar1;
  int iVar2;
  second_type pEVar3;
  DescriptorPool *pDVar4;
  string *psVar5;
  long *plVar6;
  EnumValueOptions *pEVar7;
  size_type *psVar8;
  EnumValuesByNumberMap *collection;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  string enum_value_name;
  EnumValueDescriptor *result;
  undefined1 *local_98 [2];
  undefined1 local_88 [16];
  undefined1 local_78 [32];
  second_type local_58;
  string local_50;
  
  local_78._0_8_ = parent;
  local_78._8_4_ = number;
  pEVar3 = FindPtrOrNull<std::unordered_map<std::pair<google::protobuf::EnumDescriptor_const*,int>,google::protobuf::EnumValueDescriptor_const*,google::protobuf::(anonymous_namespace)::PointerIntegerPairHash<std::pair<google::protobuf::EnumDescriptor_const*,int>>,std::equal_to<std::pair<google::protobuf::EnumDescriptor_const*,int>>,std::allocator<std::pair<std::pair<google::protobuf::EnumDescriptor_const*,int>const,google::protobuf::EnumValueDescriptor_const*>>>>
                     (&this->enum_values_by_number_,(first_type *)local_78);
  if (pEVar3 == (second_type)0x0) {
    __mutex = &this->unknown_enum_values_mu_;
    iVar2 = pthread_mutex_lock((pthread_mutex_t *)__mutex);
    if (iVar2 != 0) {
LAB_002e6902:
      std::__throw_system_error(iVar2);
    }
    collection = &this->unknown_enum_values_by_number_;
    local_78._0_8_ = parent;
    local_78._8_4_ = number;
    pEVar3 = FindPtrOrNull<std::unordered_map<std::pair<google::protobuf::EnumDescriptor_const*,int>,google::protobuf::EnumValueDescriptor_const*,google::protobuf::(anonymous_namespace)::PointerIntegerPairHash<std::pair<google::protobuf::EnumDescriptor_const*,int>>,std::equal_to<std::pair<google::protobuf::EnumDescriptor_const*,int>>,std::allocator<std::pair<std::pair<google::protobuf::EnumDescriptor_const*,int>const,google::protobuf::EnumValueDescriptor_const*>>>>
                       (collection,(first_type *)local_78);
    pthread_mutex_unlock((pthread_mutex_t *)__mutex);
    if (pEVar3 == (second_type)0x0) {
      iVar2 = pthread_mutex_lock((pthread_mutex_t *)__mutex);
      if (iVar2 != 0) goto LAB_002e6902;
      local_78._0_8_ = parent;
      local_78._8_4_ = number;
      pEVar3 = FindPtrOrNull<std::unordered_map<std::pair<google::protobuf::EnumDescriptor_const*,int>,google::protobuf::EnumValueDescriptor_const*,google::protobuf::(anonymous_namespace)::PointerIntegerPairHash<std::pair<google::protobuf::EnumDescriptor_const*,int>>,std::equal_to<std::pair<google::protobuf::EnumDescriptor_const*,int>>,std::allocator<std::pair<std::pair<google::protobuf::EnumDescriptor_const*,int>const,google::protobuf::EnumValueDescriptor_const*>>>>
                         (collection,(first_type *)local_78);
      if (pEVar3 == (second_type)0x0) {
        StringPrintf_abi_cxx11_
                  ((string *)local_78,"UNKNOWN_ENUM_VALUE_%s_%d",**(undefined8 **)parent,
                   (ulong)(uint)number);
        pDVar4 = DescriptorPool::internal_generated_pool();
        internal::AssignDescriptors((DescriptorTable *)0x2e67c0);
        this_00 = (pDVar4->tables_)._M_t.
                  super___uniq_ptr_impl<google::protobuf::DescriptorPool::Tables,_std::default_delete<google::protobuf::DescriptorPool::Tables>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_google::protobuf::DescriptorPool::Tables_*,_std::default_delete<google::protobuf::DescriptorPool::Tables>_>
                  .super__Head_base<0UL,_google::protobuf::DescriptorPool::Tables_*,_false>.
                  _M_head_impl;
        pEVar3 = (second_type)DescriptorPool::Tables::AllocateBytes(this_00,0x28);
        local_58 = pEVar3;
        psVar5 = DescriptorPool::Tables::AllocateString(this_00,(string *)local_78);
        *(string **)pEVar3 = psVar5;
        local_98[0] = local_88;
        lVar1 = **(long **)(parent + 8);
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_98,lVar1,(*(long **)(parent + 8))[1] + lVar1);
        std::__cxx11::string::append((char *)local_98);
        plVar6 = (long *)std::__cxx11::string::_M_append((char *)local_98,local_78._0_8_);
        psVar8 = (size_type *)(plVar6 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar6 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar8) {
          local_50.field_2._M_allocated_capacity = *psVar8;
          local_50.field_2._8_8_ = plVar6[3];
          local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
        }
        else {
          local_50.field_2._M_allocated_capacity = *psVar8;
          local_50._M_dataplus._M_p = (pointer)*plVar6;
        }
        local_50._M_string_length = plVar6[1];
        *plVar6 = (long)psVar8;
        plVar6[1] = 0;
        *(undefined1 *)(plVar6 + 2) = 0;
        psVar5 = DescriptorPool::Tables::AllocateString(this_00,&local_50);
        *(string **)(pEVar3 + 8) = psVar5;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p);
        }
        if (local_98[0] != local_88) {
          operator_delete(local_98[0]);
        }
        *(int *)(pEVar3 + 0x10) = number;
        *(EnumDescriptor **)(pEVar3 + 0x18) = parent;
        pEVar7 = EnumValueOptions::default_instance();
        *(EnumValueOptions **)(pEVar3 + 0x20) = pEVar7;
        local_50._M_string_length = CONCAT44(local_50._M_string_length._4_4_,number);
        local_50._M_dataplus._M_p = (pointer)parent;
        InsertIfNotPresent<std::unordered_map<std::pair<google::protobuf::EnumDescriptor_const*,int>,google::protobuf::EnumValueDescriptor_const*,google::protobuf::(anonymous_namespace)::PointerIntegerPairHash<std::pair<google::protobuf::EnumDescriptor_const*,int>>,std::equal_to<std::pair<google::protobuf::EnumDescriptor_const*,int>>,std::allocator<std::pair<std::pair<google::protobuf::EnumDescriptor_const*,int>const,google::protobuf::EnumValueDescriptor_const*>>>>
                  (collection,(first_type *)&local_50,&local_58);
        if ((EnumDescriptor *)local_78._0_8_ != (EnumDescriptor *)(local_78 + 0x10)) {
          operator_delete((void *)local_78._0_8_);
        }
      }
      pthread_mutex_unlock((pthread_mutex_t *)__mutex);
    }
  }
  return pEVar3;
}

Assistant:

inline const EnumValueDescriptor*
FileDescriptorTables::FindEnumValueByNumberCreatingIfUnknown(
    const EnumDescriptor* parent, int number) const {
  // First try, with map of compiled-in values.
  {
    const EnumValueDescriptor* desc = FindPtrOrNull(
        enum_values_by_number_, std::make_pair(parent, number));
    if (desc != nullptr) {
      return desc;
    }
  }
  // Second try, with reader lock held on unknown enum values: common case.
  {
    ReaderMutexLock l(&unknown_enum_values_mu_);
    const EnumValueDescriptor* desc = FindPtrOrNull(
        unknown_enum_values_by_number_, std::make_pair(parent, number));
    if (desc != nullptr) {
      return desc;
    }
  }
  // If not found, try again with writer lock held, and create new descriptor if
  // necessary.
  {
    WriterMutexLock l(&unknown_enum_values_mu_);
    const EnumValueDescriptor* desc = FindPtrOrNull(
        unknown_enum_values_by_number_, std::make_pair(parent, number));
    if (desc != nullptr) {
      return desc;
    }

    // Create an EnumValueDescriptor dynamically. We don't insert it into the
    // EnumDescriptor (it's not a part of the enum as originally defined), but
    // we do insert it into the table so that we can return the same pointer
    // later.
    std::string enum_value_name = StringPrintf("UNKNOWN_ENUM_VALUE_%s_%d",
                                               parent->name().c_str(), number);
    DescriptorPool::Tables* tables = const_cast<DescriptorPool::Tables*>(
        DescriptorPool::generated_pool()->tables_.get());
    EnumValueDescriptor* result = tables->Allocate<EnumValueDescriptor>();
    result->name_ = tables->AllocateString(enum_value_name);
    result->full_name_ =
        tables->AllocateString(parent->full_name() + "." + enum_value_name);
    result->number_ = number;
    result->type_ = parent;
    result->options_ = &EnumValueOptions::default_instance();
    InsertIfNotPresent(&unknown_enum_values_by_number_,
                            std::make_pair(parent, number), result);
    return result;
  }
}